

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O3

float __thiscall Assimp::AMFImporter::XML_ReadNode_GetVal_AsFloat(AMFImporter *this)

{
  int iVar1;
  undefined4 extraout_var;
  runtime_error *prVar2;
  AMFImporter *this_00;
  float tvalf;
  string val;
  float local_6c;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar1 == '\0') {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"XML_ReadNode_GetVal_AsFloat. No data, seems file is corrupt.","")
    ;
    std::runtime_error::runtime_error(prVar2,(string *)local_68);
    *(undefined ***)prVar2 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar1 == 3) {
    this_00 = (AMFImporter *)this->mReader;
    iVar1 = (*(this_00->super_BaseImporter)._vptr_BaseImporter[0xe])();
    ParseHelper_FixTruncatedFloatString(this_00,(char *)CONCAT44(extraout_var,iVar1),&local_48);
    fast_atoreal_move<float>(local_48._M_dataplus._M_p,&local_6c,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
    return local_6c;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "XML_ReadNode_GetVal_AsFloat. Invalid type of XML element, seems file is corrupt.","");
  std::runtime_error::runtime_error(prVar2,(string *)local_68);
  *(undefined ***)prVar2 = &PTR__runtime_error_0080bf48;
  __cxa_throw(prVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

float AMFImporter::XML_ReadNode_GetVal_AsFloat()
{
    std::string val;
    float tvalf;

	if(!mReader->read()) throw DeadlyImportError("XML_ReadNode_GetVal_AsFloat. No data, seems file is corrupt.");
	if(mReader->getNodeType() != irr::io::EXN_TEXT) throw DeadlyImportError("XML_ReadNode_GetVal_AsFloat. Invalid type of XML element, seems file is corrupt.");

	ParseHelper_FixTruncatedFloatString(mReader->getNodeData(), val);
	fast_atoreal_move(val.c_str(), tvalf, false);

	return tvalf;
}